

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool __thiscall libcellml::Units::setUnitId(Units *this,size_t index,string *id)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  ulong uVar3;
  
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[2].mId.field_2._M_allocated_capacity;
  uVar3 = ((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) - sVar2) >> 4) * 0x6db6db6db6db6db7;
  if (index <= uVar3 && uVar3 - index != 0) {
    std::__cxx11::string::_M_assign((string *)(sVar2 + index * 0x70 + 0x50));
  }
  return index <= uVar3 && uVar3 - index != 0;
}

Assistant:

bool Units::setUnitId(size_t index, const std::string &id)
{
    if (index < pFunc()->mUnitDefinitions.size()) {
        pFunc()->mUnitDefinitions[index].mId = id;
        return true;
    }
    return false;
}